

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::PostSweepRedeferralCallBack(ThreadContext *this)

{
  bool bVar1;
  OutOfMemoryException anon_var_0;
  AutoHandledExceptionType local_15;
  undefined4 local_14;
  AutoHandledExceptionType __autoHandledExceptionType;
  ThreadContext *pTStack_10;
  HRESULT hr;
  ThreadContext *this_local;
  
  pTStack_10 = this;
  bVar1 = DoTryRedeferral(this);
  if (bVar1) {
    local_14 = 0;
    AutoHandledExceptionType::AutoHandledExceptionType(&local_15,ExceptionType_OutOfMemory);
    TryRedeferral(this);
    AutoHandledExceptionType::~AutoHandledExceptionType(&local_15);
  }
  UpdateRedeferralState(this);
  return;
}

Assistant:

void
ThreadContext::PostSweepRedeferralCallBack()
{
    if (this->DoTryRedeferral())
    {
        HRESULT hr = S_OK;
        BEGIN_TRANSLATE_OOM_TO_HRESULT
        {
            this->TryRedeferral();
        }
        END_TRANSLATE_OOM_TO_HRESULT(hr);
    }